

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void testSelect(void)

{
  FILE *pFVar1;
  pointer pNVar2;
  int iVar3;
  ElementData *pEVar4;
  fd_set *in_RCX;
  fd_set *in_R8;
  char *in_R9;
  pointer this;
  fd_set *in_stack_fffffffffffffab8;
  undefined4 uVar5;
  ulong uVar6;
  allocator<char> local_529;
  Nodes nodes;
  undefined1 local_510 [32];
  string source;
  Node mainNode;
  Node node;
  stringstream buffer;
  ostream local_3b0 [376];
  ifstream file;
  streambuf local_228 [504];
  
  std::ifstream::ifstream(&file,"source/parseTest.html",_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  std::ostream::operator<<(local_3b0,local_228);
  std::__cxx11::stringbuf::str();
  crawler::parse(&node,&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mainNode,"div",(allocator<char> *)local_510);
  crawler::Node::select((Node *)&nodes,(int)&node,(fd_set *)&mainNode,in_RCX,in_R8,(timeval *)in_R9)
  ;
  std::__cxx11::string::~string((string *)&mainNode);
  pNVar2 = nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
      uVar5 = (undefined4)((ulong)in_stack_fffffffffffffab8 >> 0x20), this != pNVar2;
      this = this + 1) {
    test_count = test_count + 1;
    pEVar4 = crawler::Node::getElementData(this);
    iVar3 = strcmp((pEVar4->tagName)._M_dataplus._M_p,"div");
    pFVar1 = _stderr;
    if (iVar3 == 0) {
      test_pass = test_pass + 1;
    }
    else {
      pEVar4 = crawler::Node::getElementData(this);
      in_R8 = (fd_set *)0xd5;
      in_R9 = "strcmp((result.getElementData().getTagName().c_str()), (\"div\")) == 0";
      in_RCX = (fd_set *)(pEVar4->tagName)._M_dataplus._M_p;
      fprintf(pFVar1,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
              "testSelect",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
             );
      in_stack_fffffffffffffab8 = in_RCX;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&mainNode,"#main",&local_529);
  crawler::Node::select
            ((Node *)local_510,(int)&node,(fd_set *)&mainNode,in_RCX,in_R8,(timeval *)in_R9);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::_M_move_assign
            (&nodes,(vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_510);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector
            ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_510);
  uVar6 = 0;
  std::__cxx11::string::~string((string *)&mainNode);
  test_count = test_count + 1;
  if ((long)nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
            super__Vector_impl_data._M_start == 0x88) {
    test_pass = test_pass + 1;
  }
  else {
    fprintf(_stderr,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
            "testSelect",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0xd8,"true == (nodes.size() == 1)",CONCAT44(uVar5,1),uVar6 & 0xffffffff00000000);
  }
  crawler::Node::Node(&mainNode,
                      nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  test_count = test_count + 1;
  pEVar4 = crawler::Node::getElementData(&mainNode);
  iVar3 = strcmp((pEVar4->tagName)._M_dataplus._M_p,"div");
  pFVar1 = _stderr;
  if (iVar3 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    pEVar4 = crawler::Node::getElementData(&mainNode);
    fprintf(pFVar1,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
            "testSelect",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0xda,"strcmp((mainNode.getElementData().getTagName().c_str()), (\"div\")) == 0",
            (pEVar4->tagName)._M_dataplus._M_p,"div");
  }
  test_count = test_count + 1;
  pEVar4 = crawler::Node::getElementData(&mainNode);
  crawler::ElementData::clazz_abi_cxx11_((string *)local_510,pEVar4);
  iVar3 = strcmp((char *)local_510._0_8_,"test");
  std::__cxx11::string::~string((string *)local_510);
  pFVar1 = _stderr;
  if (iVar3 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    pEVar4 = crawler::Node::getElementData(&mainNode);
    crawler::ElementData::clazz_abi_cxx11_((string *)local_510,pEVar4);
    fprintf(pFVar1,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
            "testSelect",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0xdb,"strcmp((mainNode.getElementData().clazz().c_str()), (\"test\")) == 0",
            local_510._0_8_,"test");
    std::__cxx11::string::~string((string *)local_510);
  }
  crawler::Node::~Node(&mainNode);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&nodes);
  crawler::Node::~Node(&node);
  std::__cxx11::string::~string((string *)&source);
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

void testSelect() {
  std::ifstream file("source/parseTest.html");
  std::stringstream buffer;
  buffer << file.rdbuf();
  std::string source = buffer.str();
  crawler::Node node = crawler::parse(source);
  crawler::Nodes nodes = node.select("div");
  for (auto const &result : nodes) {
    ASSERT_CSTRING_EQ(result.getElementData().getTagName().c_str(), "div");
  }
  nodes = node.select("#main");
  ASSERT_TRUE(nodes.size() == 1);
  crawler::Node mainNode = nodes.front();
  ASSERT_CSTRING_EQ(mainNode.getElementData().getTagName().c_str(), "div");
  ASSERT_CSTRING_EQ(mainNode.getElementData().clazz().c_str(), "test");
}